

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeModuleBuildLogGetString
          (ze_module_build_log_handle_t hModuleBuildLog,size_t *pSize,char *pBuildLog)

{
  ze_pfnModuleBuildLogGetString_t pfnGetString;
  ze_result_t result;
  char *pBuildLog_local;
  size_t *pSize_local;
  ze_module_build_log_handle_t hModuleBuildLog_local;
  
  pfnGetString._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c680 != (code *)0x0) {
    pfnGetString._4_4_ = (*DAT_0011c680)(hModuleBuildLog,pSize,pBuildLog);
  }
  return pfnGetString._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeModuleBuildLogGetString(
        ze_module_build_log_handle_t hModuleBuildLog,   ///< [in] handle of the module build log object.
        size_t* pSize,                                  ///< [in,out] size of build log string.
        char* pBuildLog                                 ///< [in,out][optional] pointer to null-terminated string of the log.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetString = context.zeDdiTable.ModuleBuildLog.pfnGetString;
        if( nullptr != pfnGetString )
        {
            result = pfnGetString( hModuleBuildLog, pSize, pBuildLog );
        }
        else
        {
            // generic implementation
        }

        return result;
    }